

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_branch_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,function<bool_()> *condition)

{
  anon_class_1_0_00000001 local_c9;
  StepT local_c8;
  anon_class_8_1_8991fb9c local_a8;
  ConditionalStepT local_a0;
  anon_class_40_2_32150188 local_70;
  ConditionalStepT local_48;
  undefined1 local_21;
  function<bool_()> *local_20;
  function<bool_()> *condition_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_21 = 0;
  local_20 = condition;
  condition_local = (function<bool_()> *)this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_70.this = this;
  std::function<bool_()>::function(&local_70.condition,local_20);
  std::function<n_e_s::core::StepResult()>::
  function<n_e_s::core::Mos6502::create_branch_instruction(std::function<bool()>const&)::__0,void>
            ((function<n_e_s::core::StepResult()> *)&local_48,&local_70);
  Pipeline::push_conditional(__return_storage_ptr__,&local_48);
  std::function<n_e_s::core::StepResult_()>::~function(&local_48);
  create_branch_instruction(std::function<bool()>const&)::$_0::~__0((__0 *)&local_70);
  local_a8.this = this;
  std::function<n_e_s::core::StepResult()>::
  function<n_e_s::core::Mos6502::create_branch_instruction(std::function<bool()>const&)::__1,void>
            ((function<n_e_s::core::StepResult()> *)&local_a0,&local_a8);
  Pipeline::push_conditional(__return_storage_ptr__,&local_a0);
  std::function<n_e_s::core::StepResult_()>::~function(&local_a0);
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_branch_instruction(std::function<bool()>const&)::__2,void>
            ((function<void()> *)&local_c8,&local_c9);
  Pipeline::push(__return_storage_ptr__,&local_c8);
  std::function<void_()>::~function(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_branch_instruction(
        const std::function<bool()> &condition) {
    Pipeline result;

    result.push_conditional([this, condition] {
        if (!condition()) {
            ++registers_->pc;
            return StepResult::Stop;
        }
        return StepResult::Continue;
    });

    result.push_conditional([this] {
        const uint8_t offset = mmu_->read_byte(registers_->pc++);
        const uint16_t page = high_byte(registers_->pc);

        registers_->pc += to_signed(offset);

        if (page != high_byte(registers_->pc)) {
            // We crossed a page boundary so we spend 1 more cycle.
            return StepResult::Continue;
        }
        return StepResult::Stop;
    });

    result.push([] { /* Do nothing. */ });

    return result;
}